

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O1

void __thiscall QDockAreaLayout::apply(QDockAreaLayout *this,bool animate)

{
  int iVar1;
  QMainWindowLayout *pQVar2;
  undefined4 extraout_var;
  long lVar3;
  
  pQVar2 = qt_mainwindow_layout(this->mainWindow);
  lVar3 = 0x40;
  do {
    QDockAreaLayoutInfo::apply((QDockAreaLayoutInfo *)((long)this->corners + lVar3),animate);
    lVar3 = lVar3 + 0x70;
  } while (lVar3 != 0x200);
  if (this->centralWidgetItem != (QLayoutItem *)0x0) {
    iVar1 = (*this->centralWidgetItem->_vptr_QLayoutItem[8])();
    if ((char)iVar1 == '\0') {
      iVar1 = (*this->centralWidgetItem->_vptr_QLayoutItem[0xd])();
      QWidgetAnimator::animate
                ((QWidgetAnimator *)&pQVar2->widgetAnimator,(QWidget *)CONCAT44(extraout_var,iVar1),
                 &this->centralWidgetRect,animate);
    }
  }
  if (this->sep == 1) {
    updateSeparatorWidgets(this);
    return;
  }
  return;
}

Assistant:

void QDockAreaLayout::apply(bool animate)
{
    QWidgetAnimator &widgetAnimator = qt_mainwindow_layout(mainWindow)->widgetAnimator;

    for (int i = 0; i < QInternal::DockCount; ++i)
        docks[i].apply(animate);
    if (centralWidgetItem != nullptr && !centralWidgetItem->isEmpty()) {
        widgetAnimator.animate(centralWidgetItem->widget(), centralWidgetRect,
                                animate);
    }
#if QT_CONFIG(tabbar)
    if (sep == 1)
        updateSeparatorWidgets();
#endif // QT_CONFIG(tabbar)
}